

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_copy.cpp
# Opt level: O3

bool Image2Trinity(string *path,string *param_2)

{
  pointer *ppbVar1;
  pointer puVar2;
  bool bVar3;
  pointer pbVar4;
  element_type *peVar5;
  undefined1 uVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int len;
  int iVar11;
  Data *pDVar12;
  exception *peVar13;
  uint8_t *puVar14;
  long lVar15;
  byte *pbVar16;
  bool bVar17;
  Sector *s;
  unique_ptr<Trinity,_std::default_delete<Trinity>_> trinity;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices;
  shared_ptr<Disk> disk;
  string name;
  byte local_ba;
  undefined1 local_b9;
  uint8_t *local_b8;
  Sector *local_b0;
  _Head_base<0UL,_Trinity_*,_false> local_a8;
  int local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  shared_ptr<Disk> local_78;
  char *local_68;
  undefined8 local_60;
  char local_58;
  undefined7 uStack_57;
  ulong local_48;
  pointer local_40;
  char *local_38;
  
  local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Disk *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&local_78,(allocator<Disk> *)&local_68);
  local_b0 = (Sector *)0x0;
  local_68 = &local_58;
  local_60 = 0;
  local_58 = '\0';
  uVar6 = ReadImage(path,&local_78,true);
  if ((bool)uVar6) {
    puVar14 = (uint8_t *)0x1;
    local_b9 = uVar6;
    do {
      peVar5 = local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      Header::Header((Header *)&local_98,0,0,(int)puVar14,2);
      bVar7 = Disk::find(peVar5,(Header *)&local_98,&local_b0);
      local_b8 = puVar14;
      if (!bVar7) goto LAB_0014584c;
      lVar15 = 0;
      bVar7 = true;
      do {
        while( true ) {
          bVar3 = bVar7;
          pDVar12 = Sector::data_copy(local_b0,0);
          puVar2 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppbVar1 = &local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,puVar2 + lVar15 + 1,puVar2 + lVar15 + 0xb);
          std::__cxx11::string::operator=((string *)&local_68,(string *)&local_98);
          if (local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
            operator_delete(local_98.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((local_98.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          pbVar16 = puVar2 + lVar15;
          if (((*pbVar16 & 0x3f) != 0x13) || (pbVar16[0xf2] == 0xff)) break;
          std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_68);
          pbVar4 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = strcasecmp((char *)local_98.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,"auto");
          bVar17 = iVar9 != 0;
          if (pbVar4 != (pointer)ppbVar1) {
            operator_delete(pbVar4,(ulong)((long)&((local_98.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
          }
          lVar15 = 0x100;
          bVar7 = false;
          if (!(bool)(iVar9 != 0 & bVar3)) {
            if (iVar9 != 0) {
              pbVar16 = (byte *)0x0;
            }
            goto LAB_001455c0;
          }
        }
        lVar15 = 0x100;
        pbVar16 = (byte *)0x0;
        bVar7 = false;
      } while (bVar3);
      bVar17 = true;
LAB_001455c0:
    } while ((bVar17) && (puVar14 = (uint8_t *)(ulong)((uint)local_b8 + 1), (uint)local_b8 < 10));
    if (bVar17) {
LAB_0014584c:
      peVar13 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[38]>
                (peVar13,(char (*) [38])"no suitable auto-executing code found");
      __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar10 = TPeek(pbVar16 + 0xec,0x4000);
    iVar9 = TPeek(pbVar16 + 0xf2,0);
    len = TPeek(pbVar16 + 0xef,0);
    if (0x5fff < (int)(len + uVar10) && (int)uVar10 < 0x8000) {
      peVar13 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[47]>
                (peVar13,(char (*) [47])"code overlaps 6000-7fff range used by TrinLoad");
      __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_9c = iVar9;
    local_48 = (ulong)uVar10;
    puVar14 = AllocMem(len);
    bVar8 = pbVar16[0xd];
    local_ba = pbVar16[0xe];
    if (0 < len) {
      iVar9 = 0;
      uVar10 = 9;
      local_b8 = puVar14;
      do {
        peVar5 = local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        Header::Header((Header *)&local_98,(uint)(bVar8 & 0x7f),(uint)(bVar8 >> 7),(uint)local_ba,2)
        ;
        bVar7 = Disk::find(peVar5,(Header *)&local_98,&local_b0);
        if (!bVar7) {
LAB_001457f6:
          peVar13 = (exception *)__cxa_allocate_exception(0x10);
          CylHead::CylHead((CylHead *)&local_98,(uint)(bVar8 & 0x7f),(uint)(bVar8 >> 7));
          util::exception::exception<char_const(&)[21],CylHead,char_const(&)[8],unsigned_char&>
                    (peVar13,(char (*) [21])"end of file reading ",(CylHead *)&local_98,
                     (char (*) [8])0x1ae146,&local_ba);
          __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar11 = Sector::data_size(local_b0);
        puVar14 = local_b8;
        if (iVar11 != 0x200) goto LAB_001457f6;
        pDVar12 = Sector::data_copy(local_b0,0);
        iVar11 = len - iVar9;
        if ((int)(0x1fe - uVar10) < len - iVar9) {
          iVar11 = 0x1fe - uVar10;
        }
        memcpy(puVar14 + iVar9,
               (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar10,(long)iVar11);
        iVar9 = iVar11 + iVar9;
        puVar2 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar8 = puVar2[0x1fe];
        local_ba = puVar2[0x1ff];
        uVar10 = 0;
      } while (iVar9 < len);
    }
    Trinity::Open();
    Trinity::devices_abi_cxx11_(&local_98,local_a8._M_head_impl);
    iVar9 = local_9c;
    uVar6 = local_b9;
    local_38 = local_68;
    local_40 = *(pointer *)
                local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    Message<char_const*,char_const*>(msgStatus,"Sending %s to %s...",&local_38,(char **)&local_40);
    Trinity::send_file(local_a8._M_head_impl,puVar14,len,(int)local_48,iVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::~unique_ptr
              ((unique_ptr<Trinity,_std::default_delete<Trinity>_> *)&local_a8);
    FreeMem(puVar14);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return (bool)uVar6;
}

Assistant:

bool Image2Trinity(const std::string& path, const std::string&/*trinity_path*/) // ToDo: use trinity_path for record
{
    auto disk = std::make_shared<Disk>();
    const Sector* s = nullptr;
    const MGT_DIR* pdir = nullptr;
    std::string name;

    if (!ReadImage(path, disk))
        return false;

    // Scanning the first 10 directory sectors should be enough
    for (auto sector = 1; !pdir && sector <= MGT_SECTORS; ++sector)
    {
        if (!disk->find(Header(0, 0, sector, 2), s))
            break;

        // Each sector contains 2 MGT directory entries
        for (auto entry = 0; !pdir && entry < 2; ++entry)
        {
            pdir = reinterpret_cast<const MGT_DIR*>(s->data_copy().data() + 256 * entry);

            // Extract the first 4 characters of a potential MGT filename
            name = std::string(reinterpret_cast<const char*>(pdir->abName), 10);

            // Reject if not a code file, or no auto-execute, or not named AUTO*
            if ((pdir->bType & 0x3f) != 19 || pdir->bExecutePage == 0xff ||
                strcasecmp(name.substr(0, 4).c_str(), "auto"))
                pdir = nullptr;
        }
    }

    if (!pdir)
        throw util::exception("no suitable auto-executing code found");

    auto start_addr = TPeek(&pdir->bStartPage, 16384);
    auto exec_addr = TPeek(&pdir->bExecutePage);
    auto file_length = TPeek(&pdir->bLengthInPages);

    // Check the code wouldn't overwrite TrinLoad
    if (start_addr < 0x8000 && (start_addr + file_length) >= 0x6000)
        throw util::exception("code overlaps 6000-7fff range used by TrinLoad");

    auto uPos = 0;
    MEMORY mem(file_length);

    // The file start sector is taken from the directory entry.
    // Code files have a 9-byte metadata header, which must be skipped.
    auto trk = pdir->bStartTrack;
    auto sec = pdir->bStartSector;
    auto uOffset = MGT_FILE_HEADER_SIZE;

    // Loop until we've read the full file
    while (uPos < file_length)
    {
        // Bit 7 of the track number indicates head 1
        uint8_t cyl = (trk & 0x7f);
        uint8_t head = trk >> 7;

        if (!disk->find(Header(cyl, head, sec, 2), s) || s->data_size() != SECTOR_SIZE)
            throw util::exception("end of file reading ", CylHead(cyl, head), " sector", sec);

        // Determine the size of data in this sector, which is at most 510 bytes.
        // The final 2 bytes contain the location of the next sector.
        auto uBlock = std::min(file_length - uPos, 510 - uOffset);
        auto& data = s->data_copy();

        memcpy(mem + uPos, data.data() + uOffset, uBlock);
        uPos += uBlock;
        uOffset = 0;

        // Follow the chain to the next sector
        trk = data[510];
        sec = data[511];
    }

    // Scan the local network for SAM machines running TrinLoad
    auto trinity = Trinity::Open();
    auto devices = trinity->devices();

    // Send the code file to the first device that responded
    Message(msgStatus, "Sending %s to %s...", name.c_str(), devices[0].c_str());
    trinity->send_file(mem, mem.size, start_addr, exec_addr);

    return true;
}